

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O1

bool leveldb::ParseFileName(string *filename,uint64_t *number,FileType *type)

{
  long *__s1;
  ulong uVar1;
  char *__s1_00;
  bool bVar2;
  int iVar3;
  FileType FVar4;
  uint64_t num;
  Slice rest;
  uint64_t local_40;
  Slice local_38;
  
  __s1 = (long *)(filename->_M_dataplus)._M_p;
  uVar1 = filename->_M_string_length;
  local_38.data_ = (char *)__s1;
  local_38.size_ = uVar1;
  if (uVar1 == 3) {
    iVar3 = bcmp(__s1,"LOG",3);
    if (iVar3 != 0) goto LAB_0010ae44;
LAB_0010af36:
    *number = 0;
    *type = kInfoLogFile;
LAB_0010afaa:
    bVar2 = true;
  }
  else {
    if (uVar1 == 4) {
      iVar3 = bcmp(__s1,"LOCK",4);
      if (iVar3 == 0) {
        *number = 0;
        *type = kDBLockFile;
        goto LAB_0010afaa;
      }
    }
    else if (uVar1 == 7) {
      iVar3 = bcmp(__s1,"CURRENT",7);
      if (iVar3 == 0) {
        *number = 0;
        *type = kCurrentFile;
        goto LAB_0010afaa;
      }
      iVar3 = bcmp(__s1,"LOG.old",7);
      if (iVar3 == 0) goto LAB_0010af36;
    }
LAB_0010ae44:
    if ((uVar1 < 9) || ((char)__s1[1] != '-' || *__s1 != 0x54534546494e414d)) {
      bVar2 = ConsumeDecimalNumber(&local_38,&local_40);
      __s1_00 = local_38.data_;
      if (bVar2) {
        if (local_38.size_ == 6) {
          iVar3 = bcmp(local_38.data_,".dbtmp",6);
          if (iVar3 == 0) {
            FVar4 = kTempFile;
            goto LAB_0010af9f;
          }
        }
        else if (local_38.size_ == 4) {
          iVar3 = bcmp(local_38.data_,".log",4);
          if (iVar3 == 0) {
            FVar4 = kLogFile;
          }
          else {
            iVar3 = bcmp(__s1_00,".sst",4);
            FVar4 = kTableFile;
            if ((iVar3 != 0) && (iVar3 = bcmp(__s1_00,".ldb",4), iVar3 != 0)) goto LAB_0010af79;
          }
LAB_0010af9f:
          *type = FVar4;
          goto LAB_0010afa2;
        }
      }
    }
    else {
      local_38.data_ = (char *)((long)__s1 + 9);
      local_38.size_ = uVar1 - 9;
      bVar2 = ConsumeDecimalNumber(&local_38,&local_40);
      if ((bVar2) && (local_38.size_ == 0)) {
        *type = kDescriptorFile;
LAB_0010afa2:
        *number = local_40;
        goto LAB_0010afaa;
      }
    }
LAB_0010af79:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ParseFileName(const std::string& filename, uint64_t* number,
                   FileType* type) {
  Slice rest(filename);
  if (rest == "CURRENT") {
    *number = 0;
    *type = kCurrentFile;
  } else if (rest == "LOCK") {
    *number = 0;
    *type = kDBLockFile;
  } else if (rest == "LOG" || rest == "LOG.old") {
    *number = 0;
    *type = kInfoLogFile;
  } else if (rest.starts_with("MANIFEST-")) {
    rest.remove_prefix(strlen("MANIFEST-"));
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    if (!rest.empty()) {
      return false;
    }
    *type = kDescriptorFile;
    *number = num;
  } else {
    // Avoid strtoull() to keep filename format independent of the
    // current locale
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    Slice suffix = rest;
    if (suffix == Slice(".log")) {
      *type = kLogFile;
    } else if (suffix == Slice(".sst") || suffix == Slice(".ldb")) {
      *type = kTableFile;
    } else if (suffix == Slice(".dbtmp")) {
      *type = kTempFile;
    } else {
      return false;
    }
    *number = num;
  }
  return true;
}